

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int client_connect(char *fileName)

{
  int iVar1;
  ssize_t sVar2;
  char local_198 [4];
  int nBytes;
  char buffer [256];
  undefined1 local_8a [8];
  sockaddr_un address;
  int socket_fd;
  char *fileName_local;
  
  unique0x1000016b = fileName;
  address.sun_path._100_4_ = socket(1,1,0);
  if ((int)address.sun_path._100_4_ < 0) {
    printf("socket() failed\n");
    fileName_local._4_4_ = -1;
  }
  else {
    memset(local_8a,0,0x6e);
    local_8a._0_2_ = 1;
    sprintf(local_8a + 2,stack0xffffffffffffffe8);
    iVar1 = connect(address.sun_path._100_4_,(sockaddr *)local_8a,0x6e);
    if (iVar1 == 0) {
      iVar1 = snprintf(local_198,0x100,"hello from a client");
      write(address.sun_path._100_4_,local_198,(long)iVar1);
      sVar2 = read(address.sun_path._100_4_,local_198,0x100);
      local_198[(int)sVar2] = '\0';
      printf("message from server: %s\n",local_198);
      close(address.sun_path._100_4_);
      fileName_local._4_4_ = 0;
    }
    else {
      printf("connect() failed\n");
      fileName_local._4_4_ = -1;
    }
  }
  return fileName_local._4_4_;
}

Assistant:

int client_connect(const char* fileName)
{
    int socket_fd = socket(PF_UNIX, SOCK_STREAM, 0);
    if(socket_fd < 0)
    {
        printf("socket() failed\n");
        return (-1);
    }

    struct sockaddr_un address;
    memset(&address, 0, sizeof(struct sockaddr_un));
    address.sun_family = AF_UNIX;
    sprintf(address.sun_path, fileName);

    if(connect(socket_fd, (struct sockaddr*)&address, sizeof(struct sockaddr_un)) != 0)
    {
        printf("connect() failed\n");
        return (-1);
    }

    char buffer[256];
    int nBytes = snprintf(buffer, 256, "hello from a client");
    write(socket_fd, buffer, nBytes);

    nBytes = read(socket_fd, buffer, 256);
    buffer[nBytes] = 0;

    printf("message from server: %s\n", buffer);

    close(socket_fd);

    return 0;
}